

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O0

lzma_ret lzma_filters_copy(lzma_filter *src,lzma_filter *dest,lzma_allocator *allocator)

{
  void *pvVar1;
  ulong uVar2;
  long local_40;
  size_t j;
  ulong uStack_30;
  lzma_ret ret;
  size_t i;
  lzma_allocator *allocator_local;
  lzma_filter *dest_local;
  lzma_filter *src_local;
  
  if ((src == (lzma_filter *)0x0) || (dest == (lzma_filter *)0x0)) {
    src_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    uStack_30 = 0;
    while( true ) {
      if (src[uStack_30].id == 0xffffffffffffffff) {
        if (uStack_30 < 6) {
          dest[uStack_30].id = 0xffffffffffffffff;
          dest[uStack_30].options = (void *)0x0;
          return LZMA_OK;
        }
        __assert_fail("i <= LZMA_FILTERS_MAX + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/filter_common.c"
                      ,0xb1,
                      "lzma_ret lzma_filters_copy(const lzma_filter *, lzma_filter *, lzma_allocator *)"
                     );
      }
      if (uStack_30 == 4) break;
      dest[uStack_30].id = src[uStack_30].id;
      if (src[uStack_30].options == (void *)0x0) {
        dest[uStack_30].options = (void *)0x0;
      }
      else {
        for (local_40 = 0; src[uStack_30].id != features[local_40].id; local_40 = local_40 + 1) {
          if (features[local_40].id == 0xffffffffffffffff) {
            j._4_4_ = LZMA_OPTIONS_ERROR;
            goto LAB_00adedec;
          }
        }
        pvVar1 = lzma_alloc(features[local_40].options_size,allocator);
        dest[uStack_30].options = pvVar1;
        if (dest[uStack_30].options == (void *)0x0) {
          j._4_4_ = LZMA_MEM_ERROR;
          goto LAB_00adedec;
        }
        memcpy(dest[uStack_30].options,src[uStack_30].options,features[local_40].options_size);
      }
      uStack_30 = uStack_30 + 1;
    }
    j._4_4_ = LZMA_OPTIONS_ERROR;
LAB_00adedec:
    while (uVar2 = uStack_30 - 1, uStack_30 != 0) {
      lzma_free(dest[uVar2].options,allocator);
      dest[uVar2].options = (void *)0x0;
      uStack_30 = uVar2;
    }
    src_local._4_4_ = j._4_4_;
  }
  return src_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_copy(const lzma_filter *src, lzma_filter *dest,
		lzma_allocator *allocator)
{
	size_t i;
	lzma_ret ret;

	if (src == NULL || dest == NULL)
		return LZMA_PROG_ERROR;

	for (i = 0; src[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// There must be a maximum of four filters plus
		// the array terminator.
		if (i == LZMA_FILTERS_MAX) {
			ret = LZMA_OPTIONS_ERROR;
			goto error;
		}

		dest[i].id = src[i].id;

		if (src[i].options == NULL) {
			dest[i].options = NULL;
		} else {
			// See if the filter is supported only when the
			// options is not NULL. This might be convenient
			// sometimes if the app is actually copying only
			// a partial filter chain with a place holder ID.
			//
			// When options is not NULL, the Filter ID must be
			// supported by us, because otherwise we don't know
			// how big the options are.
			size_t j;
			for (j = 0; src[i].id != features[j].id; ++j) {
				if (features[j].id == LZMA_VLI_UNKNOWN) {
					ret = LZMA_OPTIONS_ERROR;
					goto error;
				}
			}

			// Allocate and copy the options.
			dest[i].options = lzma_alloc(features[j].options_size,
					allocator);
			if (dest[i].options == NULL) {
				ret = LZMA_MEM_ERROR;
				goto error;
			}

			memcpy(dest[i].options, src[i].options,
					features[j].options_size);
		}
	}

	// Terminate the filter array.
	assert(i <= LZMA_FILTERS_MAX + 1);
	dest[i].id = LZMA_VLI_UNKNOWN;
	dest[i].options = NULL;

	return LZMA_OK;

error:
	// Free the options which we have already allocated.
	while (i-- > 0) {
		lzma_free(dest[i].options, allocator);
		dest[i].options = NULL;
	}

	return ret;
}